

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O2

void __thiscall OpenMD::Velocitizer::randomize(Velocitizer *this,RealType temperature)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  result_type_conflict1 rVar4;
  int iVar5;
  Molecule *pMVar6;
  StuntDouble *this_00;
  long lVar7;
  ulong uVar8;
  pointer ppSVar9;
  double dVar10;
  MoleculeIterator mi;
  Vector3d j;
  Vector3d v;
  Mat3x3d I;
  Vector3d vdrift;
  normal_distribution<double> local_98;
  RectMatrix<double,_3U,_3U> local_78;
  
  Vector<double,_3U>::Vector(&v.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&j.super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&I.super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&vdrift.super_Vector<double,_3U>);
  mi._M_node = (_Base_ptr)0x0;
  local_98._M_param._M_mean._0_4_ = 0;
  local_98._M_param._M_mean._4_4_ = 0;
  local_98._M_param._M_stddev._0_4_ = 0;
  local_98._M_param._M_stddev._4_4_ = 0x3ff00000;
  local_98._M_saved = 0.0;
  local_98._M_saved_available = false;
  iVar1 = this->info_->ndfRaw_;
  iVar5 = SimInfo::getNdf(this->info_);
  dVar10 = (temperature * 8.31451e-07 * (double)iVar1) / ((double)iVar5 + (double)iVar5);
  pMVar6 = SimInfo::beginMolecule(this->info_,&mi);
  dVar10 = dVar10 + dVar10;
  while (pMVar6 != (Molecule *)0x0) {
    ppSVar9 = (pMVar6->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar9 !=
        (pMVar6->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001e199a;
    this_00 = (StuntDouble *)0x0;
    while (this_00 != (StuntDouble *)0x0) {
      dVar3 = dVar10 / this_00->mass_;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        rVar4 = std::normal_distribution<double>::operator()
                          (&local_98,
                           (this->randNumGen_).
                           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        v.super_Vector<double,_3U>.data_[lVar7] = rVar4 * dVar3;
      }
      StuntDouble::setVel(this_00,&v);
      if (this_00->objType_ - otDAtom < 2) {
        (*this_00->_vptr_StuntDouble[5])(&local_78,this_00);
        RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&I,&local_78);
        if (this_00->linear_ == false) {
          for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 8) {
            dVar3 = *(double *)
                     ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                            [0] + lVar7 * 4) * dVar10;
            if (dVar3 < 0.0) {
              dVar3 = sqrt(dVar3);
            }
            else {
              dVar3 = SQRT(dVar3);
            }
            rVar4 = std::normal_distribution<double>::operator()
                              (&local_98,
                               (this->randNumGen_).
                               super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
            *(double *)((long)j.super_Vector<double,_3U>.data_ + lVar7) = rVar4 * dVar3;
          }
        }
        else {
          uVar2 = this_00->linearAxis_;
          uVar8 = (long)(int)(uVar2 + 1) % 3 & 0xffffffff;
          j.super_Vector<double,_3U>.data_[uVar2] = 0.0;
          dVar3 = *(double *)
                   ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                   uVar8 * 0x20) * dVar10;
          if (dVar3 < 0.0) {
            dVar3 = sqrt(dVar3);
          }
          else {
            dVar3 = SQRT(dVar3);
          }
          rVar4 = std::normal_distribution<double>::operator()
                            (&local_98,
                             (this->randNumGen_).
                             super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          j.super_Vector<double,_3U>.data_[uVar8] = rVar4 * dVar3;
          uVar8 = (long)(int)(uVar2 + 2) % 3 & 0xffffffff;
          dVar3 = *(double *)
                   ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                   uVar8 * 0x20) * dVar10;
          if (dVar3 < 0.0) {
            dVar3 = sqrt(dVar3);
          }
          else {
            dVar3 = SQRT(dVar3);
          }
          rVar4 = std::normal_distribution<double>::operator()
                            (&local_98,
                             (this->randNumGen_).
                             super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          j.super_Vector<double,_3U>.data_[uVar8] = rVar4 * dVar3;
        }
        StuntDouble::setJ(this_00,&j);
      }
      ppSVar9 = ppSVar9 + 1;
      this_00 = (StuntDouble *)0x0;
      if (ppSVar9 !=
          (pMVar6->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001e199a:
        this_00 = *ppSVar9;
      }
    }
    pMVar6 = SimInfo::nextMolecule(this->info_,&mi);
  }
  removeComDrift(this);
  if ((this->globals_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\0') {
    removeAngularDrift(this);
  }
  return;
}

Assistant:

void Velocitizer::randomize(RealType temperature) {
    Vector3d v;
    Vector3d j;
    Mat3x3d I;
    int l, m, n;
    Vector3d vdrift;
    RealType vbar;
    RealType jbar;
    RealType av2;
    RealType kebar;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;

    std::normal_distribution<RealType> normalDistribution {0.0, 1.0};

    kebar = Constants::kB * temperature * info_->getNdfRaw() /
            (2.0 * info_->getNdf());
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        // uses equipartition theory to solve for vbar in angstrom/fs

        av2  = 2.0 * kebar / sd->getMass();
        vbar = sqrt(av2);

        // picks random velocities from a gaussian distribution
        // centered on vbar

        for (int k = 0; k < 3; k++) {
          v[k] = vbar * normalDistribution(*randNumGen_);
        }
        sd->setVel(v);

        if (sd->isDirectional()) {
          I = sd->getI();

          if (sd->isLinear()) {
            l = sd->linearAxis();
            m = (l + 1) % 3;
            n = (l + 2) % 3;

            j[l] = 0.0;
            jbar = sqrt(2.0 * kebar * I(m, m));
            j[m] = jbar * normalDistribution(*randNumGen_);
            jbar = sqrt(2.0 * kebar * I(n, n));
            j[n] = jbar * normalDistribution(*randNumGen_);
          } else {
            for (int k = 0; k < 3; k++) {
              jbar = sqrt(2.0 * kebar * I(k, k));
              j[k] = jbar * normalDistribution(*randNumGen_);
            }
          }

          sd->setJ(j);
        }
      }
    }

    removeComDrift();

    // Remove angular drift if we are not using periodic boundary
    // conditions:

    if (!globals_->getUsePeriodicBoundaryConditions()) removeAngularDrift();
  }